

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice.h
# Opt level: O2

bool leveldb::ParseInternalKey(Slice *internal_key,ParsedInternalKey *result)

{
  ulong uVar1;
  char *pcVar2;
  ulong uVar3;
  ValueType VVar4;
  
  uVar1 = internal_key->size_;
  if (uVar1 < 8) {
    return false;
  }
  pcVar2 = internal_key->data_;
  uVar3 = *(ulong *)(pcVar2 + (uVar1 - 8));
  VVar4 = (ValueType)uVar3 & 0xff;
  result->sequence = uVar3 >> 8;
  result->type = VVar4;
  (result->user_key).data_ = pcVar2;
  (result->user_key).size_ = uVar1 - 8;
  return VVar4 < 2;
}

Assistant:

size_t size() const { return size_; }